

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O2

void EV_StartLightGlowing(int tag,int upper,int lower,int tics)

{
  sector_t_conflict *psVar1;
  uint uVar2;
  DSectorEffect *pDVar3;
  DGlow2 *this;
  int end;
  FSectorTagIterator it;
  
  if (0 < tics) {
    end = lower;
    if (upper < lower) {
      end = upper;
    }
    if (lower < upper) {
      lower = upper;
    }
    if (tag == 0) {
      it.start = 0;
    }
    else {
      it.start = tagManager.TagHashFirst[(ulong)(uint)tag & 0xff];
    }
    it.searchtag = tag;
    while( true ) {
      uVar2 = FSectorTagIterator::Next(&it);
      psVar1 = sectors;
      if ((int)uVar2 < 0) break;
      pDVar3 = GC::ReadBarrier<DSectorEffect>((DSectorEffect **)&sectors[uVar2].lightingdata);
      if (pDVar3 == (DSectorEffect *)0x0) {
        this = (DGlow2 *)DObject::operator_new(0x58);
        DGlow2::DGlow2(this,(sector_t *)(psVar1 + uVar2),lower,end,tics,false);
      }
    }
  }
  return;
}

Assistant:

void EV_StartLightGlowing (int tag, int upper, int lower, int tics)
{
	int secnum;

	// If tics is non-positive, then we can't really do anything.
	if (tics <= 0)
	{
		return;
	}

	if (upper < lower)
	{
		int temp = upper;
		upper = lower;
		lower = temp;
	}

	FSectorTagIterator it(tag);
	while ((secnum = it.Next()) >= 0)
	{
		sector_t *sec = &sectors[secnum];
		if (sec->lightingdata)
			continue;
		
		new DGlow2 (sec, upper, lower, tics, false);
	}
}